

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
::solver_inequalities_Zcoeff
          (solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  pointer pmVar3;
  pointer pfVar4;
  byte bVar5;
  bool bVar6;
  container_type *pcVar7;
  double *pdVar8;
  int *piVar9;
  rc_data *prVar10;
  subsolver_type *psVar11;
  bound_factor *__s;
  ulong uVar12;
  undefined8 extraout_RAX;
  int bk_min;
  ulong uVar13;
  subsolver_type sVar14;
  long lVar15;
  int bk_max;
  int iVar16;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar17;
  pointer pfVar18;
  ulong uVar19;
  uint *puVar20;
  uint uVar21;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  *psVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  ulong local_78;
  size_t local_68;
  ulong local_48;
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  pvVar17 = csts;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar19 = (ulong)(this->ap).m_rows_values.m_length;
  uVar13 = uVar19 * 8;
  pdVar8 = (double *)operator_new__(uVar13);
  memset(pdVar8,0,uVar13);
  uVar19 = uVar19 << 2;
  (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar8;
  piVar9 = (int *)operator_new__(uVar19);
  memset(piVar9,0,uVar19);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar9;
  pmVar3 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3;
  uVar13 = (long)*(pointer *)
                  ((long)&(pmVar3->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar3->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  if (lVar15 != 0x28) {
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar28 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar29 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar30 = vpbroadcastq_avx512f();
    uVar13 = 0;
    auVar31 = vpbroadcastq_avx512f();
    do {
      auVar32 = vpbroadcastq_avx512f();
      auVar33 = vmovdqa64_avx512f(auVar30);
      vpmullq_avx512dq(auVar26,auVar28);
      uVar13 = uVar13 + 8;
      auVar26 = vpaddq_avx512f(auVar26,auVar29);
      auVar30 = vporq_avx512f(auVar32,auVar27);
      uVar19 = vpcmpuq_avx512f(auVar30,auVar31,2);
      auVar30 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar3->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar17));
      bVar5 = (byte)uVar19;
      auVar32._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar30._8_8_;
      auVar32._0_8_ = (ulong)(bVar5 & 1) * auVar30._0_8_;
      auVar32._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar30._16_8_;
      auVar32._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar30._24_8_;
      auVar32._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar30._32_8_;
      auVar32._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar30._40_8_;
      auVar32._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar30._48_8_;
      auVar32._56_8_ = (uVar19 >> 7) * auVar30._56_8_;
      auVar30 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar17->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar3->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar34._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar30._8_8_;
      auVar34._0_8_ = (ulong)(bVar5 & 1) * auVar30._0_8_;
      auVar34._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar30._16_8_;
      auVar34._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar30._24_8_;
      auVar34._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar30._32_8_;
      auVar34._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar30._40_8_;
      auVar34._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar30._48_8_;
      auVar34._56_8_ = (uVar19 >> 7) * auVar30._56_8_;
      auVar30 = vpsubq_avx512f(auVar32,auVar34);
      auVar30 = vpsraq_avx512f(auVar30,3);
      auVar30 = vpmaxuq_avx512f(auVar33,auVar30);
    } while (((lVar15 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar13);
    auVar26 = vmovdqa64_avx512f(auVar30);
    auVar27._0_8_ = (ulong)(bVar5 & 1) * auVar26._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar33._0_8_;
    bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
    auVar27._8_8_ = (ulong)bVar6 * auVar26._8_8_ | (ulong)!bVar6 * auVar33._8_8_;
    bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
    auVar27._16_8_ = (ulong)bVar6 * auVar26._16_8_ | (ulong)!bVar6 * auVar33._16_8_;
    bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
    auVar27._24_8_ = (ulong)bVar6 * auVar26._24_8_ | (ulong)!bVar6 * auVar33._24_8_;
    bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
    auVar27._32_8_ = (ulong)bVar6 * auVar26._32_8_ | (ulong)!bVar6 * auVar33._32_8_;
    bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
    auVar27._40_8_ = (ulong)bVar6 * auVar26._40_8_ | (ulong)!bVar6 * auVar33._40_8_;
    bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
    auVar27._48_8_ = (ulong)bVar6 * auVar26._48_8_ | (ulong)!bVar6 * auVar33._48_8_;
    auVar27._56_8_ = (uVar19 >> 7) * auVar26._56_8_ | (ulong)!SUB81(uVar19 >> 7,0) * auVar33._56_8_;
    auVar25 = vextracti64x4_avx512f(auVar27,1);
    auVar26 = vpmaxuq_avx512f(auVar27,ZEXT3264(auVar25));
    auVar23 = vpmaxuq_avx512vl(auVar26._0_16_,auVar26._16_16_);
    auVar24 = vpshufd_avx(auVar23,0xee);
    auVar24 = vpmaxuq_avx512vl(auVar23,auVar24);
    uVar13 = auVar24._0_8_;
  }
  uVar13 = -(ulong)(uVar13 >> 0x3c != 0) | uVar13 << 4;
  prVar10 = (rc_data *)operator_new__(uVar13);
  memset(prVar10,0,uVar13);
  uVar19 = (ulong)m_;
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
  ._M_head_impl = prVar10;
  psVar11 = (subsolver_type *)operator_new__(uVar19);
  memset(psVar11,0,uVar19);
  (this->Z)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_false>
  ._M_head_impl = psVar11;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar19;
  uVar13 = SUB168(auVar24 * ZEXT816(0xc),0);
  if (SUB168(auVar24 * ZEXT816(0xc),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  __s = (bound_factor *)operator_new__(uVar13);
  memset(__s,0,uVar13);
  uVar19 = uVar19 << 3;
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
  ._M_head_impl = __s;
  if (m_ < 0) {
    uVar19 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar19);
  memset(pdVar8,0,uVar19);
  (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar8;
  local_48 = 0;
  pcVar7 = &(this->bb).subvector.m_container;
  (pcVar7->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar7->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->bb).subvector.m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = (undefined1  [16])0x0;
  (this->bb).subvector.m_free_list_head = 0xffffffff;
  p_Var1 = &(this->ex).constraints._M_t._M_impl.super__Rb_tree_header;
  (this->bb).items.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bb).items.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bb).items.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bb).items.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar26 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  (this->ex).items =
       (vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item>_>
        )auVar26._0_24_;
  (this->ex).flat_constraints = (vector<int,_std::allocator<int>_>)auVar26._24_24_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar26._48_8_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar26._56_8_;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = 0;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  uVar13 = ((long)(csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  if ((int)uVar13 != 0) {
    uVar19 = 0;
    local_68 = 0;
    local_78 = 0;
    do {
      psVar11 = (this->Z)._M_t.
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_false>
                ._M_head_impl;
      psVar11[uVar19] = linear;
      pmVar3 = (csts->
               super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar18 = *(pointer *)
                 &pmVar3[uVar19].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar4 = *(pointer *)
                ((long)&pmVar3[uVar19].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar18 == pfVar4) {
        sVar14 = linear;
        iVar16 = 0;
        bk_max = 0;
        uVar12 = 0;
      }
      else {
        sVar14 = linear;
        lVar15 = 0;
        iVar16 = 0;
        bk_max = 0;
        puVar20 = (uint *)((this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                           _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                           super__Head_base<0UL,_int_*,_false>._M_head_impl + (int)local_48);
        do {
          uVar2 = pfVar18->factor;
          psVar22 = (solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                     *)(ulong)uVar2;
          if (uVar2 == 0) {
            itm::solver_inequalities_Zcoeff();
            goto LAB_0057645c;
          }
          *puVar20 = uVar2;
          uVar2 = pfVar18->factor;
          uVar21 = 0;
          if ((int)uVar2 < 0) {
            uVar21 = uVar2;
          }
          if (uVar2 - 2 < 0xfffffffd) {
            sVar14 = branch_and_bound;
            psVar11[uVar19] = branch_and_bound;
          }
          iVar16 = iVar16 + uVar21;
          pfVar18 = pfVar18 + 1;
          puVar20 = puVar20 + 1;
          lVar15 = lVar15 + -1;
          bk_max = bk_max + (~((int)uVar2 >> 0x1f) & uVar2);
        } while (pfVar18 != pfVar4);
        local_48 = (local_48 & 0xffffffff) - lVar15;
        uVar12 = -lVar15;
        if (sVar14 == branch_and_bound && uVar12 < 10) {
          sVar14 = exhaustive;
          psVar11[uVar19] = exhaustive;
        }
      }
      pmVar3 = pmVar3 + uVar19;
      bk_min = pmVar3->min;
      if (bk_min == pmVar3->max) {
        __s[uVar19].min = bk_min;
        bk_max = bk_min;
      }
      else {
        if ((bk_min <= iVar16) || (bk_max <= pmVar3->max)) {
          if (sVar14 == branch_and_bound) {
            sVar14 = unconstrained_branch_and_bound;
          }
          else {
            if (sVar14 != exhaustive) goto LAB_0057637c;
            sVar14 = unconstrained_exhaustive;
          }
          psVar11[uVar19] = sVar14;
        }
LAB_0057637c:
        if (bk_min < iVar16) {
          bk_min = iVar16;
        }
        __s[uVar19].min = bk_min;
        if (pmVar3->max < bk_max) {
          bk_max = pmVar3->max;
        }
      }
      __s[uVar19].max = bk_max;
      if (local_78 <= uVar12) {
        local_78 = uVar12;
      }
      if ((sVar14 | unconstrained_branch_and_bound) == unconstrained_exhaustive) {
        exhaustive_solver<baryonyx::itm::maximize_tag,double>::
        build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                  ((exhaustive_solver<baryonyx::itm::maximize_tag,double> *)&this->ex,(int)uVar19,
                   &pmVar3->elements,bk_min,bk_max);
        local_68 = local_68 + 1;
        __s = (this->b)._M_t.
              super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
              .
              super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
              ._M_head_impl;
      }
      psVar22 = this;
      if (__s[uVar19].max < __s[uVar19].min) {
LAB_0057645c:
        itm::solver_inequalities_Zcoeff();
        operator_delete__(__s);
        (psVar22->b)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::bound_factor_*,_false>
        ._M_head_impl = (bound_factor *)0x0;
        psVar11 = (psVar22->Z)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_false>
                  ._M_head_impl;
        if (psVar11 != (subsolver_type *)0x0) {
          operator_delete__(psVar11);
        }
        (psVar22->Z)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::subsolver_type_*,_false>
        ._M_head_impl = (subsolver_type *)0x0;
        prVar10 = (psVar22->R)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
                  ._M_head_impl;
        if (prVar10 != (rc_data *)0x0) {
          operator_delete__(prVar10);
        }
        (psVar22->R)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
        ._M_head_impl = (rc_data *)0x0;
        piVar9 = (psVar22->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if (piVar9 != (int *)0x0) {
          operator_delete__(piVar9);
        }
        (psVar22->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
        pdVar8 = (psVar22->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (psVar22->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
        sparse_matrix<int>::~sparse_matrix(&this->ap);
        _Unwind_Resume(extraout_RAX);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uVar13 & 0xffffffff));
    if (local_68 != 0) {
      exhaustive_solver<baryonyx::itm::maximize_tag,_double>::reserve(&this->ex,local_78,local_68);
    }
  }
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
  ::reserve(&(this->bb).items,local_78);
  std::vector<signed_char,_std::allocator<signed_char>_>::reserve
            ((vector<signed_char,_std::allocator<signed_char>_> *)&this->bb,local_78 << 10);
  return;
}

Assistant:

solver_inequalities_Zcoeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_Zcoeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , Z(std::make_unique<subsolver_type[]>(m_))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        // Count the maximum function elements in the constraint where a least
        // one coefficient is in Z. To be use with the branch-and-bound and
        // exhaustive solvers.
        std::size_t z_variables_max = 0;

        // Count the maximum constraint number where at leat one coefficient is
        // in Z. To be used with the exhaustive solver.
        std::size_t z_constraint_exhaustive = 0;

        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;
            std::size_t local_z_variables_max = 0;

            Z[i] =
              subsolver_type::linear; // Default, Z solver use the classical
                                      // Bastert selection for 101 problem.

            for (const auto& cst : csts[i].elements) {
                bx_ensures(cst.factor);
                A[id++] = cst.factor;
                ++local_z_variables_max;

                if (cst.factor > 0)
                    upper += cst.factor;
                else
                    lower += cst.factor;

                if (cst.factor < -1 || cst.factor > 1) {
                    Z[i] = subsolver_type::branch_and_bound;
                }
            }

            if (Z[i] == subsolver_type::branch_and_bound &&
                local_z_variables_max < maximum_factor_exhaustive_solver)
                Z[i] = subsolver_type::exhaustive;

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                if (lower >= csts[i].min || upper <= csts[i].max) {
                    if (Z[i] == subsolver_type::branch_and_bound)
                        Z[i] = subsolver_type::unconstrained_branch_and_bound;
                    else if (Z[i] == subsolver_type::exhaustive)
                        Z[i] = subsolver_type::unconstrained_exhaustive;
                }

                b[i].min = std::max(lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            z_variables_max = std::max(z_variables_max, local_z_variables_max);

            if (Z[i] == subsolver_type::exhaustive ||
                Z[i] == subsolver_type::unconstrained_exhaustive) {
                z_constraint_exhaustive++;
                ex.build_constraints(i, csts[i].elements, b[i].min, b[i].max);
            }

            logger::log("Is Z: {} ({}) with {} <= {}\n",
                        static_cast<int>(Z[i]),
                        local_z_variables_max,
                        b[i].min,
                        b[i].max);

            bx_ensures(b[i].min <= b[i].max);
        }

        if (z_constraint_exhaustive > 0)
            ex.reserve(z_variables_max, z_constraint_exhaustive);

        bb.reserve(z_variables_max);
    }